

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock.cpp
# Opt level: O3

VkResult fill_out_count_pointer_pair<VkQueueFamilyProperties>
                   (vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                    *data_vec,uint32_t *pCount,VkQueueFamilyProperties *pData)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined8 uVar4;
  VkResult VVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  
  if (pCount != (uint32_t *)0x0) {
    uVar7 = (*(long *)(data_vec + 8) - *(long *)data_vec >> 3) * -0x5555555555555555;
    if (pData == (VkQueueFamilyProperties *)0x0) {
      VVar5 = VK_SUCCESS;
      uVar6 = uVar7 & 0xffffffff;
    }
    else {
      uVar8 = (ulong)*pCount;
      uVar6 = uVar7 & 0xffffffff;
      if (uVar8 <= uVar7 && uVar7 - uVar8 != 0) {
        uVar6 = (ulong)*pCount;
      }
      if ((int)uVar6 != 0) {
        lVar9 = 0;
        do {
          lVar3 = *(long *)data_vec;
          *(undefined8 *)((long)&(pData->minImageTransferGranularity).height + lVar9) =
               *(undefined8 *)(lVar3 + 0x10 + lVar9);
          puVar1 = (undefined8 *)(lVar3 + lVar9);
          uVar4 = puVar1[1];
          puVar2 = (undefined8 *)((long)&pData->queueFlags + lVar9);
          *puVar2 = *puVar1;
          puVar2[1] = uVar4;
          lVar9 = lVar9 + 0x18;
        } while (uVar6 * 0x18 != lVar9);
        uVar8 = (ulong)*pCount;
        uVar7 = (*(long *)(data_vec + 8) - *(long *)data_vec >> 3) * -0x5555555555555555;
      }
      VVar5 = (uint)(uVar8 < uVar7) * 5;
    }
    *pCount = (uint32_t)uVar6;
    return VVar5;
  }
  return VK_ERROR_OUT_OF_HOST_MEMORY;
}

Assistant:

VkResult fill_out_count_pointer_pair(std::vector<T> const& data_vec, uint32_t* pCount, T* pData) {
    if (pCount == nullptr) {
        return VK_ERROR_OUT_OF_HOST_MEMORY;
    }
    if (pData == nullptr) {
        if (pCount) *pCount = static_cast<uint32_t>(data_vec.size());
        return VK_SUCCESS;
    } else {
        uint32_t amount_written = 0;
        uint32_t amount_to_write = static_cast<uint32_t>(data_vec.size());
        if (*pCount < data_vec.size()) {
            amount_to_write = *pCount;
        }
        for (size_t i = 0; i < amount_to_write; i++) {
            pData[i] = data_vec[i];
            amount_written++;
        }
        if (*pCount < data_vec.size()) {
            *pCount = amount_written;
            return VK_INCOMPLETE;
        }
        *pCount = amount_written;
        return VK_SUCCESS;
    }
}